

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O1

void print_help(void)

{
  puts("Usage: gravity [options] [arguments...]");
  putchar(10);
  puts("To start the REPL (not yet supported):");
  puts("  gravity");
  putchar(10);
  puts("To compile and execute file:");
  puts("  gravity example.gravity");
  putchar(10);
  puts("Available options are:");
  puts("  --version          show version information and exit");
  puts("  --help             show command line usage and exit");
  puts("  -c input_file      compile input_file");
  puts("  -o output_file     specify output file name (default to gravity.json)");
  puts("  -x input_file      execute input_file (JSON format expected)");
  puts("  -i source_code     compile and execute source_code string");
  puts("  -q                 don\'t print result and execution time");
  puts("  -t folder          run unit tests from folder");
  return;
}

Assistant:

static void print_help (void) {
    printf("Usage: gravity [options] [arguments...]\n");
    printf("\n");
    printf("To start the REPL (not yet supported):\n");
    printf("  gravity\n");
    printf("\n");
    printf("To compile and execute file:\n");
    printf("  gravity example.gravity\n");
    printf("\n");
    printf("Available options are:\n");
    printf("  --version          show version information and exit\n");
    printf("  --help             show command line usage and exit\n");
    printf("  -c input_file      compile input_file\n");
    printf("  -o output_file     specify output file name (default to gravity.json)\n");
    printf("  -x input_file      execute input_file (JSON format expected)\n");
    printf("  -i source_code     compile and execute source_code string\n");
    printf("  -q                 don't print result and execution time\n");
    printf("  -t folder          run unit tests from folder\n");
}